

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O3

cbtHullTriangle * ConvexDecomposition::extrudable(float epsilon)

{
  cbtHullTriangle *pcVar1;
  ulong uVar2;
  cbtHullTriangle *pcVar3;
  
  uVar2 = 0;
  pcVar3 = (cbtHullTriangle *)0x0;
  do {
    pcVar1 = *(cbtHullTriangle **)(tris + uVar2 * 8);
    if ((pcVar3 == (cbtHullTriangle *)0x0) ||
       ((pcVar1 != (cbtHullTriangle *)0x0 && (pcVar3->rise < pcVar1->rise)))) {
      pcVar3 = pcVar1;
    }
    uVar2 = uVar2 + 1;
  } while (DAT_00b6ffa0 != uVar2);
  pcVar1 = (cbtHullTriangle *)0x0;
  if (epsilon < pcVar3->rise) {
    pcVar1 = pcVar3;
  }
  return pcVar1;
}

Assistant:

cbtHullTriangle *extrudable(float epsilon)
{
	int i;
	cbtHullTriangle *t=NULL;
	for(i=0;i<tris.count;i++)
	{
		if(!t || (tris[i] && t->rise<tris[i]->rise))
		{
			t = tris[i];
		}
	}
	return (t->rise >epsilon)?t:NULL ;
}